

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

nng_err pipe_get(nng_pipe p,char *name,void *val,size_t *szp,nni_type t)

{
  nng_err nVar1;
  nni_pipe *local_30;
  nni_pipe *pipe;
  
  nVar1 = nni_pipe_find(&local_30,p.id);
  if (nVar1 == NNG_OK) {
    nVar1 = nni_pipe_getopt(local_30,name,val,(size_t *)0x0,(nni_opt_type)szp);
    nni_pipe_rele(local_30);
  }
  return nVar1;
}

Assistant:

static nng_err
pipe_get(nng_pipe p, const char *name, void *val, size_t *szp, nni_type t)
{
	nng_err   rv;
	nni_pipe *pipe;

	if ((rv = nni_pipe_find(&pipe, p.id)) != 0) {
		return (rv);
	}
	rv = nni_pipe_getopt(pipe, name, val, szp, t);
	nni_pipe_rele(pipe);
	return (rv);
}